

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheNewString(xmlXPathParserContextPtr pctxt,xmlChar *val)

{
  xmlXPathContextPtr pxVar1;
  void *pvVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *copy;
  xmlXPathContextCachePtr cache;
  xmlXPathContextPtr ctxt;
  xmlXPathObjectPtr ret;
  xmlChar *val_local;
  xmlXPathParserContextPtr pctxt_local;
  
  pxVar1 = pctxt->context;
  if (((pxVar1 == (xmlXPathContextPtr)0x0) || (pxVar1->cache == (void *)0x0)) ||
     (pvVar2 = pxVar1->cache, *(long *)((long)pvVar2 + 8) == 0)) {
    pctxt_local = (xmlXPathParserContextPtr)xmlXPathNewString(val);
    if (pctxt_local == (xmlXPathParserContextPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  else {
    ret = (xmlXPathObjectPtr)val;
    if (val == (xmlChar *)0x0) {
      ret = (xmlXPathObjectPtr)0x24e92e;
    }
    pxVar3 = (xmlXPathObjectPtr)xmlStrdup((xmlChar *)ret);
    if (pxVar3 == (xmlXPathObjectPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
      pctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else {
      pctxt_local = *(xmlXPathParserContextPtr *)((long)pvVar2 + 8);
      *(xmlXPathObjectPtr *)((long)pvVar2 + 8) = pctxt_local->value;
      *(int *)((long)pvVar2 + 0x18) = *(int *)((long)pvVar2 + 0x18) + -1;
      *(undefined4 *)&pctxt_local->cur = 4;
      pctxt_local->value = pxVar3;
    }
  }
  return (xmlXPathObjectPtr)pctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewString(xmlXPathParserContextPtr pctxt, const xmlChar *val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
            xmlChar *copy;

            if (val == NULL)
                val = BAD_CAST "";
            copy = xmlStrdup(val);
            if (copy == NULL) {
                xmlXPathPErrMemory(pctxt);
                return(NULL);
            }

	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
	    ret->type = XPATH_STRING;
            ret->stringval = copy;
	    return(ret);
	}
    }

    ret = xmlXPathNewString(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}